

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O3

void Ssc_GiaSimProcessRefined(Gia_Man_t *p,Vec_Int_t *vRefined)

{
  ulong *puVar1;
  int iVar2;
  Gia_Rpr_t *pGVar3;
  uint uVar4;
  void *__ptr;
  ulong uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  Gia_Rpr_t GVar11;
  uint uVar12;
  ulong uVar13;
  
  iVar2 = vRefined->nSize;
  if (iVar2 != 0) {
    uVar8 = iVar2 / 3 + 99;
    while( true ) {
      do {
        uVar10 = uVar8 + 1;
        uVar4 = uVar8 & 1;
        uVar8 = uVar10;
      } while (uVar4 != 0);
      if (uVar10 < 9) break;
      iVar6 = 5;
      while (uVar10 % (iVar6 - 2U) != 0) {
        uVar4 = iVar6 * iVar6;
        iVar6 = iVar6 + 2;
        if (uVar10 < uVar4) goto LAB_005bc40e;
      }
    }
LAB_005bc40e:
    __ptr = calloc((long)(int)uVar10,4);
    if (0 < iVar2) {
      lVar7 = 0;
      do {
        iVar2 = vRefined->pArray[lVar7];
        uVar5 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - p->nRegs);
        iVar6 = (int)uVar5;
        uVar8 = iVar6 * iVar2;
        if (((int)uVar8 < 0) || (p->vSims->nSize <= (int)uVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        puVar1 = p->vSims->pArray + uVar8;
        if ((*puVar1 & 1) == 0) {
          if (iVar6 < 1) {
LAB_005bc69f:
            __assert_fail("!Ssc_GiaSimIsConst0( p, i )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                          ,0xe6,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
          }
          uVar13 = 0;
          while (puVar1[uVar13] == 0) {
            uVar13 = uVar13 + 1;
            if ((uVar5 & 0xffffffff) == uVar13) goto LAB_005bc69f;
          }
        }
        else {
          if (iVar6 < 1) goto LAB_005bc69f;
          uVar13 = 0;
          while (puVar1[uVar13] == 0xffffffffffffffff) {
            uVar13 = uVar13 + 1;
            if ((uVar5 & 0xffffffff) == uVar13) goto LAB_005bc69f;
          }
        }
        if ((*puVar1 & 1) == 0) {
          if (iVar6 < 1) {
LAB_005bc528:
            uVar8 = 0;
          }
          else {
            uVar13 = 0;
            uVar8 = 0;
            do {
              uVar8 = uVar8 ^ *(int *)(Ssc_GiaSimHashKey_s_Primes + (ulong)((uint)uVar13 & 0xf) * 4)
                              * (int)puVar1[uVar13];
              uVar13 = uVar13 + 1;
            } while ((uVar5 & 0xffffffff) != uVar13);
          }
        }
        else {
          if (iVar6 < 1) goto LAB_005bc528;
          uVar13 = 0;
          uVar8 = 0;
          do {
            uVar8 = uVar8 ^ ~(uint)puVar1[uVar13] *
                            *(int *)(Ssc_GiaSimHashKey_s_Primes + (ulong)((uint)uVar13 & 0xf) * 4);
            uVar13 = uVar13 + 1;
          } while ((uVar5 & 0xffffffff) != uVar13);
        }
        uVar4 = *(uint *)((long)__ptr + (long)(int)(uVar8 % uVar10) * 4);
        lVar9 = (long)(int)uVar4;
        if (lVar9 == 0) {
          GVar11 = p->pReprs[iVar2];
          if (((uint)GVar11 & 0xfffffff) != 0) {
            __assert_fail("Gia_ObjRepr(p, i) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                          ,0xea,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
          }
          if (p->pNexts[iVar2] != 0) {
            __assert_fail("Gia_ObjNext(p, i) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                          ,0xeb,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
          }
          p->pReprs[iVar2] = (Gia_Rpr_t)((uint)GVar11 | 0xfffffff);
        }
        else {
          p->pNexts[lVar9] = iVar2;
          pGVar3 = p->pReprs;
          uVar12 = (uint)pGVar3[lVar9] & 0xfffffff;
          if (iVar2 <= (int)uVar12 && uVar12 != 0xfffffff) {
LAB_005bc6dd:
            __assert_fail("Num == GIA_VOID || Num < Id",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x3a2,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
          }
          pGVar3[iVar2] = (Gia_Rpr_t)((uint)pGVar3[iVar2] & 0xf0000000 | uVar12);
          GVar11 = p->pReprs[iVar2];
          if ((~(uint)GVar11 & 0xfffffff) == 0) {
            if (iVar2 <= (int)uVar4 && uVar4 != 0xfffffff) goto LAB_005bc6dd;
            p->pReprs[iVar2] = (Gia_Rpr_t)((uint)GVar11 & 0xf0000000 | uVar4 & 0xfffffff);
            GVar11 = p->pReprs[iVar2];
          }
          if (((uint)GVar11 & 0xfffffff) == 0) {
            __assert_fail("Gia_ObjRepr(p, i) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                          ,0xf4,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
          }
        }
        *(int *)((long)__ptr + (long)(int)(uVar8 % uVar10) * 4) = iVar2;
        lVar7 = lVar7 + 1;
        uVar5 = (ulong)vRefined->nSize;
      } while (lVar7 < (long)uVar5);
      if (vRefined->nSize < 1) goto LAB_005bc67a;
      lVar7 = 0;
      do {
        iVar2 = vRefined->pArray[lVar7];
        if (((~(uint)p->pReprs[iVar2] & 0xfffffff) == 0) && (0 < p->pNexts[iVar2])) {
          Ssc_GiaSimClassRefineOne(p,iVar2);
          uVar5 = (ulong)(uint)vRefined->nSize;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (int)uVar5);
    }
    if (__ptr != (void *)0x0) {
LAB_005bc67a:
      free(__ptr);
      return;
    }
  }
  return;
}

Assistant:

void Ssc_GiaSimProcessRefined( Gia_Man_t * p, Vec_Int_t * vRefined )
{
    int * pTable, nTableSize, i, k, Key;
    if ( Vec_IntSize(vRefined) == 0 )
        return;
    nTableSize = Abc_PrimeCudd( 100 + Vec_IntSize(vRefined) / 3 );
    pTable = ABC_CALLOC( int, nTableSize );
    Vec_IntForEachEntry( vRefined, i, k )
    {
        assert( !Ssc_GiaSimIsConst0( p, i ) );
        Key = Ssc_GiaSimHashKey( p, i, nTableSize );
        if ( pTable[Key] == 0 )
        {
            assert( Gia_ObjRepr(p, i) == 0 );
            assert( Gia_ObjNext(p, i) == 0 );
            Gia_ObjSetRepr( p, i, GIA_VOID );
        }
        else
        {
            Gia_ObjSetNext( p, pTable[Key], i );
            Gia_ObjSetRepr( p, i, Gia_ObjRepr(p, pTable[Key]) );
            if ( Gia_ObjRepr(p, i) == GIA_VOID )
                Gia_ObjSetRepr( p, i, pTable[Key] );
            assert( Gia_ObjRepr(p, i) > 0 );
        }
        pTable[Key] = i;
    }
    Vec_IntForEachEntry( vRefined, i, k )
        if ( Gia_ObjIsHead( p, i ) )
            Ssc_GiaSimClassRefineOne( p, i );
    ABC_FREE( pTable );
}